

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void EPSG_reset(EPSG *psg)

{
  int local_14;
  int i;
  EPSG *psg_local;
  
  psg->base_count = 0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    psg->count[local_14] = 0x1000;
    psg->freq[local_14] = 0;
    psg->edge[local_14] = '\0';
    psg->volume[local_14] = '\0';
    psg->ch_out[local_14] = 0;
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    psg->reg[local_14] = '\0';
  }
  psg->adr = '\0';
  psg->noise_seed = 0xffff;
  psg->noise_count = '@';
  psg->noise_freq = '\0';
  psg->env_ptr = '\0';
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = '\x01';
  return;
}

Assistant:

void
EPSG_reset (EPSG * psg)
{
  int i;

  psg->base_count = 0;

  for (i = 0; i < 3; i++)
  {
    psg->count[i] = 0x1000;
    psg->freq[i] = 0;
    psg->edge[i] = 0;
    psg->volume[i] = 0;
    psg->ch_out[i] = 0;
  }

  //psg->mask = 0;

  for (i = 0; i < 16; i++)
    psg->reg[i] = 0;
  psg->adr = 0;

  psg->noise_seed = 0xffff;
  psg->noise_count = 0x40;
  psg->noise_freq = 0;

  //psg->env_volume = 0;
  psg->env_ptr = 0;
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = 1;

  //psg->out = 0;

}